

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupContextWindow(char *str_id,int mouse_button,bool also_over_items)

{
  bool bVar1;
  ImGuiID id;
  char *str;
  
  str = "window_context";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,str,(char *)0x0);
  if ((uint)mouse_button < 5) {
    if ((GImGui->IO).MouseReleased[(uint)mouse_button] == true) {
      bVar1 = IsWindowHovered(8);
      if ((bVar1) &&
         ((also_over_items || ((GImGui->HoveredId == 0 && (GImGui->HoveredIdPreviousFrame == 0))))))
      {
        OpenPopupEx(id);
      }
    }
    bVar1 = BeginPopupEx(id,0x141);
    return bVar1;
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1260,"bool ImGui::IsMouseReleased(int)");
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, int mouse_button, bool also_over_items)
{
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (also_over_items || !IsAnyItemHovered())
            OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}